

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string_const&>
          (basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_csv_decode_options<char> *options,error_code *ec)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *in_RDI;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *this_00;
  undefined1 local_48 [38];
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> local_22;
  
  this_00 = &local_22;
  local_22.super__Function_base._M_functor._2_8_ = in_RCX;
  local_22.super__Function_base._10_8_ = in_RDX;
  local_22._18_8_ = in_RSI;
  std::allocator<char>::allocator();
  std::function<bool(jsoncons::csv::csv_errc,jsoncons::ser_context_const&)>::
  function<jsoncons::csv::default_csv_parsing,void>(this_00,(default_csv_parsing *)in_RDI);
  basic_csv_cursor<std::__cxx11::string_const&>
            (in_RDI,this_00,local_22._18_8_,local_22.super__Function_base._10_8_,local_48,
             local_22.super__Function_base._M_functor._2_8_,0);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x42a177);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  return;
}

Assistant:

basic_csv_cursor(Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::error_code& ec)
        : basic_csv_cursor(std::allocator_arg, Allocator(),
              std::forward<Sourceable>(source),
              options,
              default_csv_parsing(),
              ec)
    {
    }